

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlElement::CopyTo(TiXmlElement *this,TiXmlElement *target)

{
  TiXmlAttribute *pTVar1;
  TiXmlNode *pTVar2;
  int iVar3;
  TiXmlAttribute *this_00;
  undefined4 extraout_var;
  TiXmlNode **ppTVar4;
  
  TiXmlNode::CopyTo(&this->super_TiXmlNode,&target->super_TiXmlNode);
  pTVar1 = (this->attributeSet).sentinel.next;
  this_00 = (TiXmlAttribute *)0x0;
  if (pTVar1 != &(this->attributeSet).sentinel) {
    this_00 = pTVar1;
  }
  for (; this_00 != (TiXmlAttribute *)0x0; this_00 = TiXmlAttribute::Next(this_00)) {
    SetAttribute(target,((this_00->name).rep_)->str,((this_00->value).rep_)->str);
  }
  ppTVar4 = &(this->super_TiXmlNode).firstChild;
  while (pTVar2 = *ppTVar4, pTVar2 != (TiXmlNode *)0x0) {
    iVar3 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[0x10])(pTVar2);
    TiXmlNode::LinkEndChild(&target->super_TiXmlNode,(TiXmlNode *)CONCAT44(extraout_var,iVar3));
    ppTVar4 = &pTVar2->next;
  }
  return;
}

Assistant:

void TiXmlElement::CopyTo(TiXmlElement* target) const {
	// superclass:
	TiXmlNode::CopyTo(target);

	// Element class:
	// Clone the attributes, then clone the children.
	const TiXmlAttribute* attribute = 0;
	for (attribute = attributeSet.First(); attribute;
		attribute = attribute->Next()) {
		target->SetAttribute(attribute->Name(), attribute->Value());
	}

	TiXmlNode* node = 0;
	for (node = firstChild; node; node = node->NextSibling()) {
		target->LinkEndChild(node->Clone());
	}
}